

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

token_data * __thiscall llama_vocab::get_token_data(llama_vocab *this,llama_token id)

{
  pointer piVar1;
  reference pvVar2;
  undefined4 in_ESI;
  size_type in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  piVar1 = std::unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>::operator->
                     ((unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_> *)
                      0x53a62b);
  if (piVar1->type == LLAMA_VOCAB_TYPE_NONE) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0xb33,"GGML_ASSERT(%s) failed","pimpl->type != LLAMA_VOCAB_TYPE_NONE");
  }
  std::unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>::operator->
            ((unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_> *)0x53a65b);
  pvVar2 = std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::at
                     ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  return pvVar2;
}

Assistant:

const llama_vocab::token_data & llama_vocab::get_token_data(llama_token id) const {
    GGML_ASSERT(pimpl->type != LLAMA_VOCAB_TYPE_NONE);
    return pimpl->id_to_token.at(id);
}